

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server-ws.c
# Opt level: O3

int lws_parse_ws(lws *wsi,uchar **buf,size_t len)

{
  uint8_t uVar1;
  uchar *puVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  uchar *puVar7;
  
  puVar7 = *buf;
  _lws_log(0x10,"%s: received %d byte packet\n","lws_parse_ws",len & 0xffffffff);
  do {
    if (len == 0) {
      _lws_log(0x10,"%s: exit with %d unused\n","lws_parse_ws",0);
      return 0;
    }
    if (wsi->rxflow_bitmap != '\0') {
      _lws_log(8,"%s: doing rxflow, caching %d\n","lws_parse_ws",len & 0xffffffff);
      iVar4 = lws_rxflow_cache(wsi,*buf,0,(int)len);
      if (iVar4 == 2) {
        _lws_log(8,"%s: trimming inside rxflow cache\n","lws_parse_ws");
      }
      else {
        puVar7 = *buf + len;
      }
      *buf = puVar7;
      return 1;
    }
    if (wsi->lws_rx_parse_state == '\x14') {
      bVar3 = true;
      do {
        uVar1 = wsi->ws->opcode;
        if ((byte)(uVar1 - 1) < 2) {
          if (len == 0) {
            len = 0;
LAB_0012363a:
            if (bVar3) goto LAB_0012363e;
            break;
          }
        }
        else if ((uVar1 != '\0') || (len == 0)) goto LAB_0012363a;
        puVar2 = *buf;
        iVar4 = lws_ws_frame_rest_is_payload(wsi,buf,len);
        iVar5 = (int)*buf - (int)puVar2;
        if ((int)len < iVar5) {
          __assert_fail("(int)lws_ptr_diff(*buf, bin) <= (int)len",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/ws/server-ws.c"
                        ,0x3ce,"int lws_parse_ws(struct lws *, unsigned char **, size_t)");
        }
        len = len - (long)iVar5;
        if (iVar4 == 0) break;
        if (iVar4 < 0) {
          _lws_log(8,"%s: rest_is_payload bailed\n","lws_parse_ws");
          return -1;
        }
        bVar3 = false;
      } while (wsi->lws_rx_parse_state == '\x14');
      iVar4 = lws_ws_rx_sm(wsi,'\x03','\0');
      uVar6 = 1;
    }
    else {
LAB_0012363e:
      puVar2 = *buf;
      *buf = puVar2 + 1;
      uVar6 = 0;
      iVar4 = lws_ws_rx_sm(wsi,'\0',*puVar2);
      len = len - 1;
    }
    if (iVar4 < 0) {
      _lws_log(8,"%s: lws_ws_rx_sm bailed %d\n","lws_parse_ws",uVar6);
      return -1;
    }
  } while( true );
}

Assistant:

int
lws_parse_ws(struct lws *wsi, unsigned char **buf, size_t len)
{
	unsigned char *bufin = *buf;
	int m, bulk = 0;

	lwsl_debug("%s: received %d byte packet\n", __func__, (int)len);

	//lwsl_hexdump_notice(*buf, len);

	/* let the rx protocol state machine have as much as it needs */

	while (len) {
		/*
		 * we were accepting input but now we stopped doing so
		 */
		if (wsi->rxflow_bitmap) {
			lwsl_info("%s: doing rxflow, caching %d\n", __func__,
				(int)len);
			/*
			 * Since we cached the remaining available input, we
			 * can say we "consumed" it.
			 *
			 * But what about the case where the available input
			 * came out of the rxflow cache already?  If we are
			 * effectively "putting it back in the cache", we have
			 * leave it where it is, already pointed to by the head.
			 */
			if (lws_rxflow_cache(wsi, *buf, 0, (int)len) ==
							LWSRXFC_TRIMMED) {
				/*
				 * We dealt with it by trimming the existing
				 * rxflow cache HEAD to account for what we used.
				 *
				 * indicate we didn't use anything to the caller
				 * so he doesn't do any consumed processing
				 */
				lwsl_info("%s: trimming inside rxflow cache\n",
					  __func__);
				*buf = bufin;
			} else
				*buf += len;

			return 1;
		}
#if !defined(LWS_WITHOUT_EXTENSIONS)
		if (wsi->ws->rx_draining_ext) {
			lwsl_debug("%s: draining rx ext\n", __func__);
			m = lws_ws_rx_sm(wsi, ALREADY_PROCESSED_IGNORE_CHAR, 0);
			if (m < 0)
				return -1;
			continue;
		}
#endif

		/* consume payload bytes efficiently */
		while (wsi->lws_rx_parse_state == LWS_RXPS_WS_FRAME_PAYLOAD &&
				(wsi->ws->opcode == LWSWSOPC_TEXT_FRAME ||
				 wsi->ws->opcode == LWSWSOPC_BINARY_FRAME ||
				 wsi->ws->opcode == LWSWSOPC_CONTINUATION) &&
		       len) {
			uint8_t *bin = *buf;

			bulk = 1;
			m = lws_ws_frame_rest_is_payload(wsi, buf, len);
			assert((int)lws_ptr_diff(*buf, bin) <= (int)len);
			len -= lws_ptr_diff(*buf, bin);

			if (!m) {

				break;
			}
			if (m < 0) {
				lwsl_info("%s: rest_is_payload bailed\n",
					  __func__);
				return -1;
			}
		}

		if (!bulk) {
			/* process the byte */
			m = lws_ws_rx_sm(wsi, 0, *(*buf)++);
			len--;
		} else {
			/*
			 * We already handled this byte in bulk, just deal
			 * with the ramifications
			 */
#if !defined(LWS_WITHOUT_EXTENSIONS)
			lwsl_debug("%s: coming out of bulk with len %d, "
				   "wsi->ws->rx_draining_ext %d\n",
				   __func__, (int)len,
				   wsi->ws->rx_draining_ext);
#endif
			m = lws_ws_rx_sm(wsi, ALREADY_PROCESSED_IGNORE_CHAR |
					      ALREADY_PROCESSED_NO_CB, 0);
		}

		if (m < 0) {
			lwsl_info("%s: lws_ws_rx_sm bailed %d\n", __func__,
				  bulk);

			return -1;
		}

		bulk = 0;
	}

	lwsl_debug("%s: exit with %d unused\n", __func__, (int)len);

	return 0;
}